

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O2

void rotate_dungeons(dw_rom *rom)

{
  short sVar2;
  dw_map_index town;
  dw_map_meta *pdVar3;
  dw_map_meta *pdVar4;
  dw_warp *pdVar5;
  dw_chest *pdVar6;
  dwr_spike_table *pdVar7;
  byte bVar8;
  dw_dungeon_tile dVar9;
  uint64_t uVar10;
  undefined1 *puVar11;
  long lVar12;
  byte bVar13;
  undefined1 *puVar14;
  size_t i;
  uint8_t *puVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint uVar18;
  uint8_t uVar19;
  dw_map_meta *meta;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  undefined1 *local_78;
  uint local_70;
  ushort uVar1;
  
  if ((rom->flags[10] & 0xc) != 0) {
    puts("Rotating and mirroring dungeons...");
    for (lVar25 = 0; lVar25 != 0xf; lVar25 = lVar25 + 1) {
      town = (&DAT_00163d70)[lVar25];
      pdVar3 = (rom->map).meta;
      uVar16 = pdVar3[town].width;
      uVar19 = pdVar3[town].height;
      uVar10 = mt_rand(0,0xf);
      if ((uVar10 & 0xff) != 0 || lVar25 != 6) {
        bVar13 = uVar16 + 1;
        bVar8 = uVar19 + 1;
        uVar22 = (ulong)((uint)bVar8 * (uint)bVar13);
        local_78 = (undefined1 *)calloc(uVar22,1);
        uVar24 = (ulong)bVar8;
        uVar23 = (ulong)(uint)bVar13;
        puVar14 = local_78;
        for (uVar21 = 0; uVar21 != uVar24; uVar21 = uVar21 + 1) {
          for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
            dVar9 = get_dungeon_tile(rom,town,(uint8_t)uVar20,(uint8_t)uVar21);
            puVar14[uVar20] = (char)dVar9;
          }
          puVar14 = puVar14 + uVar23;
        }
        if ((uVar10 & 4) != 0) {
          puVar14 = (undefined1 *)calloc(uVar22,1);
          for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
            puVar14[uVar21] = local_78[(long)(int)(bVar13 - 1) + (uVar21 % uVar23) * -2 + uVar21];
          }
          free(local_78);
          local_78 = puVar14;
        }
        if ((uVar10 & 8) != 0) {
          puVar14 = (undefined1 *)calloc(uVar22,1);
          for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
            puVar14[uVar21] =
                 local_78[((long)(int)(bVar8 - 1) - uVar21 / uVar23) * uVar23 + uVar21 % uVar23];
          }
          free(local_78);
          local_78 = puVar14;
        }
        local_70 = (uint)uVar10 & 3;
        if ((uVar10 & 3) != 0) {
          puVar14 = (undefined1 *)calloc(uVar22,1);
          if (local_70 == 1) {
            for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
              puVar14[uVar21] =
                   local_78[((long)(int)(bVar8 - 1) - uVar21 % uVar24) * uVar23 + uVar21 / uVar24];
            }
          }
          else {
            puVar11 = puVar14;
            if (local_70 == 2) {
              while (uVar22 != 0) {
                *puVar11 = local_78[uVar22 - 1];
                puVar11 = puVar11 + 1;
                uVar22 = uVar22 - 1;
              }
            }
            else {
              for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
                puVar14[uVar21] =
                     local_78[(uVar21 % uVar24) * uVar23 +
                              ((long)(int)(bVar13 - 1) - uVar21 / uVar24)];
              }
            }
          }
          free(local_78);
          local_78 = puVar14;
        }
        pdVar4 = (rom->map).meta;
        pdVar5 = (rom->map).warps_from;
        lVar12 = (((long)(rom->map).warps_to - (long)pdVar5) / 3) * 2;
        puVar15 = &pdVar5->y;
        while( true ) {
          uVar18 = (uint)uVar10 & 3;
          bVar26 = lVar12 == 0;
          lVar12 = lVar12 + -1;
          if (bVar26) break;
          if (town == ((dw_warp *)(puVar15 + -2))->map) {
            uVar16 = puVar15[-1];
            if ((uVar10 & 4) != 0) {
              uVar16 = pdVar4[town].width - uVar16;
            }
            uVar19 = *puVar15;
            if ((uVar10 & 8) != 0) {
              uVar19 = pdVar4[town].height - uVar19;
            }
            switch(uVar18) {
            case 0:
              uVar17 = uVar16;
              break;
            case 1:
              uVar17 = pdVar4[town].height - uVar19;
              uVar19 = uVar16;
              break;
            case 2:
              uVar17 = pdVar4[town].width - uVar16;
              uVar19 = pdVar4[town].height - uVar19;
              break;
            case 3:
              uVar17 = uVar19;
              uVar19 = pdVar4[town].width - uVar16;
            }
            puVar15[-1] = uVar17;
            *puVar15 = uVar19;
          }
          puVar15 = puVar15 + 3;
        }
        pdVar6 = rom->chests;
        for (lVar12 = 0; lVar12 != 0x1f; lVar12 = lVar12 + 1) {
          if (town == pdVar6[lVar12].map) {
            uVar16 = pdVar6[lVar12].x;
            if ((uVar10 & 4) != 0) {
              uVar16 = pdVar4[town].width - uVar16;
            }
            uVar19 = pdVar6[lVar12].y;
            if ((uVar10 & 8) != 0) {
              uVar19 = pdVar4[town].height - uVar19;
            }
            switch(uVar18) {
            case 0:
              uVar17 = uVar16;
              break;
            case 1:
              uVar17 = pdVar4[town].height - uVar19;
              uVar19 = uVar16;
              break;
            case 2:
              uVar17 = pdVar4[town].width - uVar16;
              uVar19 = pdVar4[town].height - uVar19;
              break;
            case 3:
              uVar17 = uVar19;
              uVar19 = pdVar4[town].width - uVar16;
            }
            pdVar6[lVar12].x = uVar17;
            pdVar6[lVar12].y = uVar19;
          }
        }
        if (lVar25 == 6) {
          pdVar7 = rom->spike_table;
          uVar16 = pdVar7->x[1];
          if ((uVar10 & 4) != 0) {
            uVar16 = pdVar4[0x15].width - uVar16;
          }
          uVar19 = pdVar7->y[1];
          if ((uVar10 & 8) != 0) {
            uVar19 = pdVar4[0x15].height - uVar19;
          }
          switch(uVar18) {
          case 0:
            uVar17 = uVar16;
            break;
          case 1:
            uVar17 = pdVar4[0x15].height - uVar19;
            uVar19 = uVar16;
            break;
          case 2:
            uVar17 = pdVar4[0x15].width - uVar16;
            uVar19 = pdVar4[0x15].height - uVar19;
            break;
          case 3:
            uVar17 = uVar19;
            uVar19 = pdVar4[0x15].width - uVar16;
          }
          pdVar7->x[1] = uVar17;
          rom->spike_table->y[1] = uVar19;
        }
        if ((uVar10 & 1) != 0) {
          pdVar4 = pdVar3 + town;
          sVar2._0_1_ = pdVar4->width;
          sVar2._1_1_ = pdVar4->height;
          uVar1._0_1_ = pdVar4->width;
          uVar1._1_1_ = pdVar4->height;
          uVar1 = sVar2 << 8 | uVar1 >> 8;
          pdVar4->width = (char)uVar1;
          pdVar4->height = (char)(uVar1 >> 8);
        }
        for (uVar22 = 0; uVar22 <= pdVar3[town].height; uVar22 = uVar22 + 1) {
          for (uVar24 = 0; uVar24 <= pdVar3[town].width; uVar24 = uVar24 + 1) {
            set_dungeon_tile(rom,town,(uint8_t)uVar24,(uint8_t)uVar22,
                             local_78[uVar24 + ((ulong)pdVar3[town].width + 1) * uVar22]);
          }
        }
        free(local_78);
      }
    }
  }
  return;
}

Assistant:

void rotate_dungeons(dw_rom *rom)
{
    size_t i;
    dw_map_index to_rotate[] = {
//         OVERWORLD,
//         CHARLOCK,
//         HAUKSNESS,
//         TANTEGEL,
//         TANTEGEL_THRONE_ROOM,
//         CHARLOCK_THRONE_ROOM,
//         KOL,
//         BRECCONARY,
//         GARINHAM,
//         CANTLIN,
//         RIMULDAR,
//         TANTEGEL_BASEMENT,
//         NORTHERN_SHRINE,
//         SOUTHERN_SHRINE,

        CHARLOCK_CAVE_1,
        CHARLOCK_CAVE_2,
        CHARLOCK_CAVE_3,
        CHARLOCK_CAVE_4,
        CHARLOCK_CAVE_5,
        CHARLOCK_CAVE_6,
        SWAMP_CAVE,
        MOUNTAIN_CAVE,
        MOUNTAIN_CAVE_2,
        GARINS_GRAVE_1,
        GARINS_GRAVE_2,
        GARINS_GRAVE_3,
        GARINS_GRAVE_4,
        ERDRICKS_CAVE,
        ERDRICKS_CAVE_2,
    };

    if (ROTATE_DUNGEONS(rom)) {
        printf("Rotating and mirroring dungeons...\n");

        for (i=0; i < sizeof(to_rotate) / sizeof(dw_map_index); i++) {
            rotate_mirror_map(rom, to_rotate[i]);
        }
    }
}